

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationRuleParser::parseTailoringString
          (CollationRuleParser *this,int32_t i,UnicodeString *raw,UErrorCode *errorCode)

{
  int32_t iVar1;
  
  iVar1 = skipWhiteSpace(this,i);
  iVar1 = parseString(this,iVar1,raw,errorCode);
  if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
     ((ushort)(raw->fUnion).fStackFields.fLengthAndFlags < 0x20)) {
    *errorCode = U_INVALID_FORMAT_ERROR;
    this->errorReason = "missing relation string";
    if (this->parseError != (UParseError *)0x0) {
      setErrorContext(this);
    }
  }
  iVar1 = skipWhiteSpace(this,iVar1);
  return iVar1;
}

Assistant:

int32_t
CollationRuleParser::parseTailoringString(int32_t i, UnicodeString &raw, UErrorCode &errorCode) {
    i = parseString(skipWhiteSpace(i), raw, errorCode);
    if(U_SUCCESS(errorCode) && raw.isEmpty()) {
        setParseError("missing relation string", errorCode);
    }
    return skipWhiteSpace(i);
}